

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O2

bool mg::fs::read_file(char *path,string *out)

{
  FILE *pFVar1;
  int __fd;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 local_1058 [8];
  char buffer [4096];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  char *local_40;
  allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_rschlaikjer[P]mangetsu_src_util_fs_cpp:49:50),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
  local_31 [8];
  __allocator_type __a2;
  
  local_40 = path;
  __fd = open(path,0);
  pFVar1 = _stderr;
  if (__fd == -1) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    bVar5 = false;
    fprintf(pFVar1,"Failed to open \'%s\' - %s\n",local_40,pcVar4);
  }
  else {
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    local_1058 = (undefined1  [8])local_31;
    (local_48._M_pi)->_M_use_count = 1;
    (local_48._M_pi)->_M_weak_count = 1;
    (local_48._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00108cf8;
    *(int *)&local_48._M_pi[1]._vptr__Sp_counted_base = __fd;
    local_48._M_pi[1]._M_use_count = 0;
    local_48._M_pi[1]._M_weak_count = 0;
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/rschlaikjer[P]mangetsu/src/util/fs.cpp:49:50),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_rschlaikjer[P]mangetsu_src_util_fs_cpp:49:50),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)local_1058);
    out->_M_string_length = 0;
    *(out->_M_dataplus)._M_p = '\0';
    do {
      sVar2 = read(__fd,(__allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_rschlaikjer[P]mangetsu_src_util_fs_cpp:49:50),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                         *)local_1058,0x1000);
      pFVar1 = _stderr;
      bVar5 = sVar2 != -1;
      if (sVar2 == -1) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"Failed to read \'%s\' - %s\n",local_40,pcVar4);
        break;
      }
      std::__cxx11::string::append((char *)out,(ulong)local_1058);
    } while (sVar2 == 0x1000);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  }
  return bVar5;
}

Assistant:

bool read_file(const char *path, std::string &out) {
  // Open file
  const int fd = open(path, O_RDONLY);
  if (fd == -1) {
    fprintf(stderr, "Failed to open '%s' - %s\n", path, strerror(errno));
    return false;
  }
  std::shared_ptr<void> _defer_close_fd(nullptr, [=](...) { close(fd); });

  static const size_t read_blocksz = 4096;
  char buffer[read_blocksz];
  out.clear();
  ssize_t bytes_read = 0;
  do {
    bytes_read = read(fd, buffer, read_blocksz);
    if (bytes_read == -1) {
      fprintf(stderr, "Failed to read '%s' - %s\n", path, strerror(errno));
      return false;
    }
    out.append(buffer, bytes_read);
  } while (bytes_read == read_blocksz);

  return true;
}